

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O1

deque<int,_ft::allocator<int>_> * __thiscall
ft::deque<int,_ft::allocator<int>_>::operator=
          (deque<int,_ft::allocator<int>_> *this,deque<int,_ft::allocator<int>_> *rhs)

{
  constDequeIterator<int,_64UL> local_60;
  undefined **local_38;
  pointer local_30;
  pointer local_28;
  pointer local_20;
  map_pointer local_18;
  
  if (rhs != this) {
    if ((deque<int,_ft::allocator<int>_> *)&stack0xffffffffffffffc8 != rhs) {
      local_30 = (rhs->m_start).m_cur;
      local_28 = (rhs->m_start).m_first;
      local_20 = (rhs->m_start).m_last;
      local_18 = (rhs->m_start).m_node;
    }
    local_38 = &PTR__dequeIterator_00112d80;
    if (&rhs->m_finish != &local_60.super_dequeIterator<int,_64UL>) {
      local_60.super_dequeIterator<int,_64UL>.m_cur = (rhs->m_finish).m_cur;
      local_60.super_dequeIterator<int,_64UL>.m_first = (rhs->m_finish).m_first;
      local_60.super_dequeIterator<int,_64UL>.m_last = (rhs->m_finish).m_last;
      local_60.super_dequeIterator<int,_64UL>.m_node = (rhs->m_finish).m_node;
    }
    local_60.super_dequeIterator<int,_64UL>._vptr_dequeIterator =
         (_func_int **)&PTR__dequeIterator_00112d80;
    deque<int,ft::allocator<int>>::assign<ft::constDequeIterator<int,64ul>>
              ((deque<int,ft::allocator<int>> *)this,
               (constDequeIterator<int,_64UL> *)&stack0xffffffffffffffc8,&local_60,(type *)0x0);
  }
  return this;
}

Assistant:

deque&	operator=(deque const & rhs) {
		if (&rhs != this) {
			this->assign(rhs.begin(), rhs.end());
		}
		return *this;
	}